

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt5a.cpp
# Opt level: O1

void __thiscall
crnlib::dxt5_endpoint_optimizer::evaluate_solution
          (dxt5_endpoint_optimizer *this,uint low_endpoint,uint high_endpoint)

{
  results *prVar1;
  uchar *puVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  bool bVar17;
  uint selector_values [8];
  uint local_58 [10];
  
  bVar3 = false;
  while( true ) {
    if (bVar3) {
      dxt5_block::get_block_values6(local_58,low_endpoint,high_endpoint);
    }
    else {
      dxt5_block::get_block_values8(local_58,low_endpoint,high_endpoint);
    }
    if ((this->m_unique_values).m_size == 0) {
      uVar9 = 0;
    }
    else {
      uVar10 = 0;
      uVar9 = 0;
      do {
        uVar11 = 0xffffffff;
        uVar13 = 0;
        uVar15 = 0;
        do {
          iVar14 = (uint)(this->m_unique_values).m_p[uVar10] - local_58[uVar13];
          uVar12 = iVar14 * (this->m_unique_value_weights).m_p[uVar10] * iVar14;
          bVar17 = uVar11 <= uVar12;
          uVar8 = uVar12;
          if (bVar17) {
            uVar8 = uVar11;
          }
          uVar11 = uVar8;
          uVar16 = uVar13 & 0xffffffff;
          if (bVar17) {
            uVar16 = uVar15;
          }
        } while ((bVar17 || uVar12 != 0) &&
                (bVar17 = uVar13 < 7, uVar13 = uVar13 + 1, uVar15 = uVar16, bVar17));
        (this->m_trial_selectors).m_p[uVar10] = (uchar)uVar16;
        uVar9 = uVar9 + uVar11;
      } while ((uVar9 <= this->m_pResults->m_error) &&
              (uVar10 = uVar10 + 1, uVar10 < (this->m_unique_values).m_size));
    }
    prVar1 = this->m_pResults;
    if (uVar9 < prVar1->m_error) {
      prVar1->m_error = uVar9;
      prVar1->m_first_endpoint = (uint8)low_endpoint;
      prVar1->m_second_endpoint = (uint8)high_endpoint;
      prVar1->m_block_type = bVar3;
      uVar4 = (this->m_trial_selectors).m_size;
      uVar5 = (this->m_trial_selectors).m_capacity;
      puVar2 = (this->m_best_selectors).m_p;
      uVar6 = (this->m_best_selectors).m_size;
      uVar7 = (this->m_best_selectors).m_capacity;
      (this->m_best_selectors).m_p = (this->m_trial_selectors).m_p;
      (this->m_best_selectors).m_size = uVar4;
      (this->m_best_selectors).m_capacity = uVar5;
      (this->m_trial_selectors).m_p = puVar2;
      (this->m_trial_selectors).m_size = uVar6;
      (this->m_trial_selectors).m_capacity = uVar7;
      if (uVar9 == 0) {
        return;
      }
    }
    if (bVar3) break;
    bVar3 = true;
    if (this->m_pParams->m_use_both_block_types == false) {
      return;
    }
  }
  return;
}

Assistant:

void dxt5_endpoint_optimizer::evaluate_solution(uint low_endpoint, uint high_endpoint)
    {
        for (uint block_type = 0; block_type < (m_pParams->m_use_both_block_types ? 2U : 1U); block_type++)
        {
            uint selector_values[8];

            if (!block_type)
            {
                dxt5_block::get_block_values8(selector_values, low_endpoint, high_endpoint);
            }
            else
            {
                dxt5_block::get_block_values6(selector_values, low_endpoint, high_endpoint);
            }

            uint64 trial_error = 0;

            for (uint i = 0; i < m_unique_values.size(); i++)
            {
                const uint val = m_unique_values[i];
                const uint weight = m_unique_value_weights[i];

                uint best_selector_error = UINT_MAX;
                uint best_selector = 0;

                for (uint j = 0; j < 8; j++)
                {
                    int selector_error = val - selector_values[j];
                    selector_error = selector_error * selector_error * (int)weight;

                    if (static_cast<uint>(selector_error) < best_selector_error)
                    {
                        best_selector_error = selector_error;
                        best_selector = j;
                        if (!best_selector_error)
                        {
                            break;
                        }
                    }
                }

                m_trial_selectors[i] = static_cast<uint8>(best_selector);
                trial_error += best_selector_error;

                if (trial_error > m_pResults->m_error)
                {
                    break;
                }
            }

            if (trial_error < m_pResults->m_error)
            {
                m_pResults->m_error = trial_error;
                m_pResults->m_first_endpoint = static_cast<uint8>(low_endpoint);
                m_pResults->m_second_endpoint = static_cast<uint8>(high_endpoint);
                m_pResults->m_block_type = static_cast<uint8>(block_type);
                m_best_selectors.swap(m_trial_selectors);

                if (!trial_error)
                {
                    break;
                }
            }
        }
    }